

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTriangleBuffer.cpp
# Opt level: O0

void __thiscall
btTriangleBuffer::processTriangle
          (btTriangleBuffer *this,btVector3 *triangle,int partId,int triangleIndex)

{
  long in_RSI;
  btTriangle tri;
  btTriangle *in_stack_ffffffffffffffb0;
  
  btTriangle::btTriangle(in_stack_ffffffffffffffb0);
  btAlignedObjectArray<btTriangle>::push_back
            (*(btAlignedObjectArray<btTriangle> **)(in_RSI + 0x10),*(btTriangle **)(in_RSI + 8));
  return;
}

Assistant:

void btTriangleBuffer::processTriangle(btVector3* triangle,int partId,int  triangleIndex)
{
		btTriangle	tri;
		tri.m_vertex0 = triangle[0];
		tri.m_vertex1 = triangle[1];
		tri.m_vertex2 = triangle[2];
		tri.m_partId = partId;
		tri.m_triangleIndex = triangleIndex;
			
		m_triangleBuffer.push_back(tri);
}